

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instr.cc
# Opt level: O3

void __thiscall flow::Instr::addOperand(Instr *this,Value *value)

{
  pointer *pppVVar1;
  iterator __position;
  BasicBlock *successor;
  Value *local_18;
  
  __position._M_current =
       (this->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_18 = value;
  if (__position._M_current ==
      (this->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<flow::Value*,std::allocator<flow::Value*>>::_M_realloc_insert<flow::Value*const&>
              ((vector<flow::Value*,std::allocator<flow::Value*>> *)&this->operands_,__position,
               &local_18);
  }
  else {
    *__position._M_current = value;
    pppVVar1 = &(this->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + 1;
  }
  Value::addUse(local_18,this);
  if (local_18 != (Value *)0x0) {
    successor = (BasicBlock *)__dynamic_cast(local_18,&Value::typeinfo,&BasicBlock::typeinfo,0);
    if (successor != (BasicBlock *)0x0) {
      BasicBlock::linkSuccessor(this->basicBlock_,successor);
    }
  }
  return;
}

Assistant:

void Instr::addOperand(Value* value) {
  operands_.push_back(value);

  value->addUse(this);

  if (BasicBlock* newBB = dynamic_cast<BasicBlock*>(value)) {
    getBasicBlock()->linkSuccessor(newBB);
  }
}